

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

void __thiscall Shader::compile(Shader *this,char *vert_src,char *frag_src,char *geom_src)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  GLuint GVar4;
  tm *ptVar5;
  ostream *poVar6;
  uint32_t uVar7;
  Shader *pSVar8;
  GLuint local_44;
  time_t rawtime;
  
  rawtime = time((time_t *)0x0);
  ptVar5 = localtime(&rawtime);
  sprintf(ta,"[%02d:%02d:%02d]: ",(ulong)(uint)ptVar5->tm_hour,(ulong)(uint)ptVar5->tm_min,
          (ulong)(uint)ptVar5->tm_sec);
  poVar6 = std::operator<<((ostream *)&std::cerr,ta);
  poVar6 = std::operator<<(poVar6,"Compiling sources: ");
  poVar6 = std::operator<<(poVar6,vert_src);
  poVar6 = std::operator<<(poVar6,' ');
  poVar6 = std::operator<<(poVar6,frag_src);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)logFile,ta);
  poVar6 = std::operator<<(poVar6,"Compiling sources: ");
  poVar6 = std::operator<<(poVar6,vert_src);
  poVar6 = std::operator<<(poVar6,' ');
  poVar6 = std::operator<<(poVar6,frag_src);
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar2 = create_shader(this,vert_src,0x8b31);
  uVar3 = create_shader(this,frag_src,0x8b30);
  if (geom_src != (char *)0x0) {
    local_44 = create_shader(this,geom_src,0x8dd9);
  }
  GVar4 = (*glad_glCreateProgram)();
  this->m_id = GVar4;
  (*glad_glAttachShader)(GVar4,uVar2);
  (*glad_glAttachShader)(this->m_id,uVar3);
  uVar1 = this->m_id;
  pSVar8 = (Shader *)(ulong)uVar1;
  if (geom_src == (char *)0x0) {
    (*glad_glLinkProgram)(uVar1);
    check_errors(pSVar8,this->m_id,2);
    uVar7 = uVar2;
    GVar4 = uVar3;
  }
  else {
    (*glad_glAttachShader)(uVar1,local_44);
    pSVar8 = (Shader *)(ulong)this->m_id;
    (*glad_glLinkProgram)(this->m_id);
    check_errors(pSVar8,this->m_id,2);
    (*glad_glDeleteShader)(uVar2);
    uVar7 = uVar3;
    GVar4 = local_44;
  }
  (*glad_glDeleteShader)(uVar7);
  (*glad_glDeleteShader)(GVar4);
  (*glad_glDetachShader)(this->m_id,uVar2);
  (*glad_glDetachShader)(this->m_id,uVar3);
  if (geom_src != (char *)0x0) {
    (*glad_glDetachShader)(this->m_id,local_44);
  }
  return;
}

Assistant:

void Shader::compile(const char *vert_src, const char *frag_src, const char *geom_src)
{
    LOG_INFO("Compiling sources: " << vert_src << ' ' << frag_src);
    GLuint sh_vert, sh_frag, sh_geom;

    // Vertex shader
    sh_vert = create_shader(vert_src, GL_VERTEX_SHADER);
    // Fragment shader
    sh_frag = create_shader(frag_src, GL_FRAGMENT_SHADER);
    // Geometry shader
    if (geom_src != nullptr)
        sh_geom = create_shader(geom_src, GL_GEOMETRY_SHADER);
    
    // Create program
    m_id = glCreateProgram();

    // Attach shaders
    glAttachShader(m_id, sh_vert);
    glAttachShader(m_id, sh_frag);
    if (geom_src != nullptr)
        glAttachShader(m_id, sh_geom);

    // Link the program and check for any link errors
    glLinkProgram(m_id);
    check_errors(m_id, LINK_ERRORS);

    // Clean up after linked, no longer needed
    glDeleteShader(sh_vert);
    glDeleteShader(sh_frag);
    if (geom_src != nullptr)
        glDeleteShader(sh_geom);

    glDetachShader(m_id, sh_vert);
    glDetachShader(m_id, sh_frag);
    if (geom_src != nullptr)
        glDetachShader(m_id, sh_geom);
}